

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.cpp
# Opt level: O0

bool MeCab::anon_unknown_14::connect<false>
               (size_t pos,Node *rnode,Node **begin_node_list,Node **end_node_list,
               Connector *connector,Allocator<mecab_node_t,_mecab_path_t> *allocator)

{
  int iVar1;
  long lVar2;
  long in_RCX;
  Node *in_RSI;
  long in_RDI;
  Connector *in_R8;
  size_t x;
  long cost;
  int lcost;
  Node *lnode;
  Node *best_node;
  long best_cost;
  Node *local_50;
  Node *local_48;
  long local_40;
  Node *local_18;
  
  local_18 = in_RSI;
  while( true ) {
    if (local_18 == (Node *)0x0) {
      return true;
    }
    local_40 = 0x7fffffff;
    local_48 = (Node *)0x0;
    for (local_50 = *(Node **)(in_RCX + in_RDI * 8); local_50 != (Node *)0x0;
        local_50 = local_50->enext) {
      iVar1 = Connector::cost(in_R8,local_50,local_18);
      lVar2 = local_50->cost + (long)iVar1;
      if (lVar2 < local_40) {
        local_48 = local_50;
        local_40 = lVar2;
      }
    }
    if (local_48 == (Node *)0x0) break;
    local_18->prev = local_48;
    local_18->next = (mecab_node_t *)0x0;
    local_18->cost = local_40;
    lVar2 = (ulong)local_18->rlength + in_RDI;
    local_18->enext = *(mecab_node_t **)(in_RCX + lVar2 * 8);
    *(Node **)(in_RCX + lVar2 * 8) = local_18;
    local_18 = local_18->bnext;
  }
  return false;
}

Assistant:

bool connect(size_t pos, Node *rnode,
                                       Node **begin_node_list,
                                       Node **end_node_list,
                                       const Connector *connector,
                                       Allocator<Node, Path> *allocator) {
  for (;rnode; rnode = rnode->bnext) {
    register long best_cost = 2147483647;
    Node* best_node = 0;
    for (Node *lnode = end_node_list[pos]; lnode; lnode = lnode->enext) {
      register int lcost = connector->cost(lnode, rnode);  // local cost
      register long cost = lnode->cost + lcost;

      if (cost < best_cost) {
        best_node  = lnode;
        best_cost  = cost;
  }

      if (IsAllPath) {
        Path *path   = allocator->newPath();
        path->cost   = lcost;
        path->rnode  = rnode;
        path->lnode  = lnode;
        path->lnext  = rnode->lpath;
        rnode->lpath = path;
        path->rnext  = lnode->rpath;
        lnode->rpath = path;
      }
    }

    // overflow check 2003/03/09
    if (!best_node) {
      return false;
  }

    rnode->prev = best_node;
    rnode->next = 0;
    rnode->cost = best_cost;
    const size_t x = rnode->rlength + pos;
    rnode->enext = end_node_list[x];
    end_node_list[x] = rnode;
  }

  return true;
  }